

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_type_and_names_match(nifti_image *nim,int show_warn)

{
  int iVar1;
  char *test_ext;
  char *test_ext_00;
  int local_4c;
  int errs;
  char *ext_i;
  char *ext_h;
  char func [27];
  int show_warn_local;
  nifti_image *nim_local;
  
  ext_h = (char *)0x79745f697466696e;
  builtin_strncpy(func,"pe_and_names_match",0x13);
  local_4c = 0;
  func._20_4_ = show_warn;
  unique0x10000395 = nim;
  if (nim == (nifti_image *)0x0) {
    if (show_warn != 0) {
      fprintf(_stderr,"** %s: missing nifti_image\n",&ext_h);
    }
    nim_local._4_4_ = -1;
  }
  else {
    if (nim->fname == (char *)0x0) {
      if (show_warn != 0) {
        fprintf(_stderr,"** %s: missing header filename\n",&ext_h);
      }
      local_4c = 1;
    }
    if (stack0xffffffffffffffe8->iname == (char *)0x0) {
      if (func._20_4_ != 0) {
        fprintf(_stderr,"** %s: missing image filename\n",&ext_h);
      }
      local_4c = local_4c + 1;
    }
    iVar1 = is_valid_nifti_type(stack0xffffffffffffffe8->nifti_type);
    if (iVar1 == 0) {
      if (func._20_4_ != 0) {
        fprintf(_stderr,"** %s: bad nifti_type %d\n",&ext_h,
                (ulong)(uint)stack0xffffffffffffffe8->nifti_type);
      }
      local_4c = local_4c + 1;
    }
    if (local_4c == 0) {
      test_ext = nifti_find_file_extension(stack0xffffffffffffffe8->fname);
      test_ext_00 = nifti_find_file_extension(stack0xffffffffffffffe8->iname);
      if (test_ext == (char *)0x0) {
        if (func._20_4_ != 0) {
          fprintf(_stderr,"-d missing NIFTI extension in header filename, %s\n",
                  stack0xffffffffffffffe8->fname);
        }
        local_4c = 1;
      }
      if (test_ext_00 == (char *)0x0) {
        if (func._20_4_ != 0) {
          fprintf(_stderr,"-d missing NIFTI extension in image filename, %s\n",
                  stack0xffffffffffffffe8->iname);
        }
        local_4c = local_4c + 1;
      }
      if (local_4c == 0) {
        if (stack0xffffffffffffffe8->nifti_type == 1) {
          iVar1 = fileext_n_compare(test_ext,".nii",4);
          if ((iVar1 != 0) && (func._20_4_ != 0)) {
            fprintf(_stderr,"-d NIFTI_FTYPE 1, but no .nii extension in header filename, %s\n",
                    stack0xffffffffffffffe8->fname);
          }
          iVar1 = fileext_n_compare(test_ext_00,".nii",4);
          if ((iVar1 != 0) && (func._20_4_ != 0)) {
            fprintf(_stderr,"-d NIFTI_FTYPE 1, but no .nii extension in image filename, %s\n",
                    stack0xffffffffffffffe8->iname);
          }
          iVar1 = strcmp(stack0xffffffffffffffe8->fname,stack0xffffffffffffffe8->iname);
          if ((iVar1 != 0) && (func._20_4_ != 0)) {
            fprintf(_stderr,"-d NIFTI_FTYPE 1, but header and image filenames differ: %s, %s\n",
                    stack0xffffffffffffffe8->fname,stack0xffffffffffffffe8->iname);
          }
        }
        else if ((stack0xffffffffffffffe8->nifti_type == 2) ||
                (stack0xffffffffffffffe8->nifti_type == 0)) {
          iVar1 = fileext_n_compare(test_ext,".hdr",4);
          if ((iVar1 != 0) && (func._20_4_ != 0)) {
            fprintf(_stderr,"-d no \'.hdr\' extension, but NIFTI type is %d, %s\n",
                    (ulong)(uint)stack0xffffffffffffffe8->nifti_type,stack0xffffffffffffffe8->fname)
            ;
          }
          iVar1 = fileext_n_compare(test_ext_00,".img",4);
          if ((iVar1 != 0) && (func._20_4_ != 0)) {
            fprintf(_stderr,"-d no \'.img\' extension, but NIFTI type is %d, %s\n",
                    (ulong)(uint)stack0xffffffffffffffe8->nifti_type,stack0xffffffffffffffe8->iname)
            ;
          }
        }
        nim_local._4_4_ = 1;
      }
      else {
        nim_local._4_4_ = 0;
      }
    }
    else {
      nim_local._4_4_ = -1;
    }
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_type_and_names_match( nifti_image * nim, int show_warn )
{
   char func[] = "nifti_type_and_names_match";
   const char * ext_h;  /* header  filename extension */
   const char * ext_i;  /* image filename extension */
   int  errs = 0;          /* error counter */

   /* sanity checks */
   if( !nim ){
      if( show_warn ) fprintf(stderr,"** %s: missing nifti_image\n", func);
      return -1;
   }
   if( !nim->fname ){
      if( show_warn ) fprintf(stderr,"** %s: missing header filename\n", func);
      errs++;
   }
   if( !nim->iname ){
      if( show_warn ) fprintf(stderr,"** %s: missing image filename\n", func);
      errs++;
   }
   if( !is_valid_nifti_type(nim->nifti_type) ){
      if( show_warn )
         fprintf(stderr,"** %s: bad nifti_type %d\n", func, nim->nifti_type);
      errs++;
   }

   if( errs ) return -1;   /* then do not proceed */

   /* get pointers to extensions */
   ext_h = nifti_find_file_extension( nim->fname );
   ext_i = nifti_find_file_extension( nim->iname );

   /* check for filename extensions */
   if( !ext_h ){
      if( show_warn )
         fprintf(stderr,"-d missing NIFTI extension in header filename, %s\n",
                 nim->fname);
      errs++;
   }
   if( !ext_i ){
      if( show_warn )
         fprintf(stderr,"-d missing NIFTI extension in image filename, %s\n",
                 nim->iname);
      errs++;
   }

   if( errs ) return 0;   /* do not proceed, but this is just a mis-match */

   /* general tests */
   if( nim->nifti_type == NIFTI_FTYPE_NIFTI1_1 ){  /* .nii */
      if( fileext_n_compare(ext_h,".nii",4) ) {
         if( show_warn )
            fprintf(stderr,
            "-d NIFTI_FTYPE 1, but no .nii extension in header filename, %s\n",
            nim->fname);
         errs++;
      }
      if( fileext_n_compare(ext_i,".nii",4) ) {
         if( show_warn )
            fprintf(stderr,
            "-d NIFTI_FTYPE 1, but no .nii extension in image filename, %s\n",
            nim->iname);
         errs++;
      }
      if( strcmp(nim->fname, nim->iname) != 0 ){
         if( show_warn )
            fprintf(stderr,
            "-d NIFTI_FTYPE 1, but header and image filenames differ: %s, %s\n",
            nim->fname, nim->iname);
         errs++;
      }
   }
   else if( (nim->nifti_type == NIFTI_FTYPE_NIFTI1_2) || /* .hdr/.img */
            (nim->nifti_type == NIFTI_FTYPE_ANALYZE) )
   {
      if( fileext_n_compare(ext_h,".hdr",4) != 0 ){
         if( show_warn )
            fprintf(stderr,"-d no '.hdr' extension, but NIFTI type is %d, %s\n",
                    nim->nifti_type, nim->fname);
         errs++;
      }
      if( fileext_n_compare(ext_i,".img",4) != 0 ){
         if( show_warn )
            fprintf(stderr,"-d no '.img' extension, but NIFTI type is %d, %s\n",
                    nim->nifti_type, nim->iname);
         errs++;
      }
   }
   /* ignore any other nifti_type */

   return 1;
}